

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O2

void __thiscall
cmExportLibraryDependenciesCommand::ConstFinalPass(cmExportLibraryDependenciesCommand *this)

{
  int iVar1;
  bool bVar2;
  cmake *pcVar3;
  cmTarget *this_00;
  char *pcVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  pointer ppcVar9;
  string *psVar10;
  __node_base *p_Var11;
  cmGeneratedFileStream *local_1c0;
  allocator local_1b1;
  cmGlobalGenerator *local_1b0;
  string valueNew;
  string ltValue;
  string valueOld;
  string targetEntry;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libTypes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsNew;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsOld;
  string local_90;
  string lib;
  string ltVar;
  
  if (this->Append == true) {
    local_1c0 = (cmGeneratedFileStream *)operator_new(0x200);
    std::ofstream::ofstream(local_1c0,(this->Filename)._M_dataplus._M_p,_S_app);
  }
  else {
    local_1c0 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream
              (local_1c0,(this->Filename)._M_dataplus._M_p,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(local_1c0,true);
  }
  if (((&(local_1c0->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(local_1c0->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    pcVar3 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    local_1b0 = pcVar3->GlobalGenerator;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &libTypes._M_t._M_impl.super__Rb_tree_header._M_header;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppcVar9 = (local_1b0->Makefiles).
                   super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppcVar9 !=
        (local_1b0->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
      p_Var11 = &((*ppcVar9)->Targets)._M_h._M_before_begin;
      while( true ) {
        p_Var11 = p_Var11->_M_nxt;
        if (p_Var11 == (__node_base *)0x0) break;
        if (0xfffffffc < *(int *)&p_Var11[0x47]._M_nxt - 4U) {
          std::__cxx11::string::string((string *)&targetEntry,(string *)(p_Var11 + 0x27));
          std::__cxx11::string::append((char *)&targetEntry);
          valueOld._M_dataplus._M_p = (pointer)&valueOld.field_2;
          valueOld._M_string_length = 0;
          valueNew._M_dataplus._M_p = (pointer)&valueNew.field_2;
          valueNew._M_string_length = 0;
          valueOld.field_2._M_local_buf[0] = '\0';
          valueNew.field_2._M_local_buf[0] = '\0';
          for (psVar10 = (string *)p_Var11[0x42]._M_nxt; psVar10 != (string *)p_Var11[0x43]._M_nxt;
              psVar10 = psVar10 + 0x28) {
            std::__cxx11::string::string((string *)&ltVar,psVar10);
            std::__cxx11::string::append((char *)&ltVar);
            ltValue._M_dataplus._M_p = (pointer)&ltValue.field_2;
            ltValue._M_string_length = 0;
            ltValue.field_2._M_local_buf[0] = '\0';
            iVar1 = *(int *)(psVar10 + 0x20);
            if (iVar1 == 0) {
              std::__cxx11::string::append((char *)&valueNew);
LAB_002d734a:
              std::__cxx11::string::assign((char *)&ltValue);
            }
            else {
              if (iVar1 == 1) {
                std::__cxx11::string::append((char *)&valueNew);
                goto LAB_002d734a;
              }
              if (iVar1 == 2) {
                std::__cxx11::string::append((char *)&valueNew);
                goto LAB_002d734a;
              }
            }
            std::__cxx11::string::string((string *)&lib,psVar10);
            this_00 = cmGlobalGenerator::FindTarget(local_1b0,&lib,false);
            if (this_00 != (cmTarget *)0x0) {
              std::__cxx11::string::string((string *)&local_90,"OUTPUT_NAME",&local_1b1);
              pcVar4 = cmTarget::GetProperty(this_00,&local_90);
              std::__cxx11::string::~string((string *)&local_90);
              if (pcVar4 != (char *)0x0) {
                std::__cxx11::string::assign((char *)&lib);
              }
            }
            std::__cxx11::string::append((string *)&valueOld);
            std::__cxx11::string::append((char *)&valueOld);
            std::__cxx11::string::append((string *)&valueNew);
            std::__cxx11::string::append((char *)&valueNew);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&libTypes,&ltVar);
            if (pmVar5->_M_string_length == 0) {
              std::__cxx11::string::_M_assign((string *)pmVar5);
            }
            else {
              bVar2 = std::operator!=(pmVar5,&ltValue);
              if (bVar2) {
                std::__cxx11::string::assign((char *)pmVar5);
              }
            }
            std::__cxx11::string::~string((string *)&lib);
            std::__cxx11::string::~string((string *)&ltValue);
            std::__cxx11::string::~string((string *)&ltVar);
          }
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&libDepsNew,&targetEntry);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&libDepsOld,&targetEntry);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          std::__cxx11::string::~string((string *)&valueNew);
          std::__cxx11::string::~string((string *)&valueOld);
          std::__cxx11::string::~string((string *)&targetEntry);
        }
      }
    }
    std::operator<<((ostream *)local_1c0,"# Generated by CMake\n\n");
    poVar6 = std::operator<<((ostream *)local_1c0,"if(");
    poVar6 = std::operator<<(poVar6,"\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4")
    ;
    std::operator<<(poVar6,")\n");
    std::operator<<((ostream *)local_1c0,"  # Information for CMake 2.6 and above.\n");
    for (p_Var7 = libDepsNew._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &libDepsNew._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      if (p_Var7[2]._M_parent != (_Base_ptr)0x0) {
        poVar6 = std::operator<<((ostream *)local_1c0,"  set(\"");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var7 + 1));
        poVar6 = std::operator<<(poVar6,"\" \"");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var7 + 2));
        std::operator<<(poVar6,"\")\n");
      }
    }
    std::operator<<((ostream *)local_1c0,"else()\n");
    std::operator<<((ostream *)local_1c0,"  # Information for CMake 2.4 and lower.\n");
    for (p_Var7 = libDepsOld._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var8 = libTypes._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
        (_Rb_tree_header *)p_Var7 != &libDepsOld._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      if (p_Var7[2]._M_parent != (_Base_ptr)0x0) {
        poVar6 = std::operator<<((ostream *)local_1c0,"  set(\"");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var7 + 1));
        poVar6 = std::operator<<(poVar6,"\" \"");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var7 + 2));
        std::operator<<(poVar6,"\")\n");
      }
    }
    for (; (_Rb_tree_header *)p_Var8 != &libTypes._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var8 + 2),"general");
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)local_1c0,"  set(\"");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 1));
        poVar6 = std::operator<<(poVar6,"\" \"");
        poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 2));
        std::operator<<(poVar6,"\")\n");
      }
    }
    std::operator<<((ostream *)local_1c0,"endif()\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&libTypes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&libDepsNew._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&libDepsOld._M_t);
  }
  else {
    cmSystemTools::Error("Error Writing ",(this->Filename)._M_dataplus._M_p,(char *)0x0,(char *)0x0)
    ;
    cmSystemTools::ReportLastSystemError("");
  }
  (*(local_1c0->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream[1])();
  return;
}

Assistant:

void cmExportLibraryDependenciesCommand::ConstFinalPass() const
{
  // Use copy-if-different if not appending.
  CM_AUTO_PTR<cmsys::ofstream> foutPtr;
  if (this->Append) {
    CM_AUTO_PTR<cmsys::ofstream> ap(
      new cmsys::ofstream(this->Filename.c_str(), std::ios::app));
    foutPtr = ap;
  } else {
    CM_AUTO_PTR<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->Filename.c_str(), true));
    ap->SetCopyIfDifferent(true);
    foutPtr = ap;
  }
  std::ostream& fout = *foutPtr;

  if (!fout) {
    cmSystemTools::Error("Error Writing ", this->Filename.c_str());
    cmSystemTools::ReportLastSystemError("");
    return;
  }

  // Collect dependency information about all library targets built in
  // the project.
  cmake* cm = this->Makefile->GetCMakeInstance();
  cmGlobalGenerator* global = cm->GetGlobalGenerator();
  const std::vector<cmMakefile*>& locals = global->GetMakefiles();
  std::map<std::string, std::string> libDepsOld;
  std::map<std::string, std::string> libDepsNew;
  std::map<std::string, std::string> libTypes;
  for (std::vector<cmMakefile*>::const_iterator i = locals.begin();
       i != locals.end(); ++i) {
    const cmTargets& tgts = (*i)->GetTargets();
    for (cmTargets::const_iterator l = tgts.begin(); l != tgts.end(); ++l) {
      // Get the current target.
      cmTarget const& target = l->second;

      // Skip non-library targets.
      if (target.GetType() < cmStateEnums::STATIC_LIBRARY ||
          target.GetType() > cmStateEnums::MODULE_LIBRARY) {
        continue;
      }

      // Construct the dependency variable name.
      std::string targetEntry = target.GetName();
      targetEntry += "_LIB_DEPENDS";

      // Construct the dependency variable value with the direct link
      // dependencies.
      std::string valueOld;
      std::string valueNew;
      cmTarget::LinkLibraryVectorType const& libs =
        target.GetOriginalLinkLibraries();
      for (cmTarget::LinkLibraryVectorType::const_iterator li = libs.begin();
           li != libs.end(); ++li) {
        std::string ltVar = li->first;
        ltVar += "_LINK_TYPE";
        std::string ltValue;
        switch (li->second) {
          case GENERAL_LibraryType:
            valueNew += "general;";
            ltValue = "general";
            break;
          case DEBUG_LibraryType:
            valueNew += "debug;";
            ltValue = "debug";
            break;
          case OPTIMIZED_LibraryType:
            valueNew += "optimized;";
            ltValue = "optimized";
            break;
        }
        std::string lib = li->first;
        if (cmTarget* libtgt = global->FindTarget(lib)) {
          // Handle simple output name changes.  This command is
          // deprecated so we do not support full target name
          // translation (which requires per-configuration info).
          if (const char* outname = libtgt->GetProperty("OUTPUT_NAME")) {
            lib = outname;
          }
        }
        valueOld += lib;
        valueOld += ";";
        valueNew += lib;
        valueNew += ";";

        std::string& ltEntry = libTypes[ltVar];
        if (ltEntry.empty()) {
          ltEntry = ltValue;
        } else if (ltEntry != ltValue) {
          ltEntry = "general";
        }
      }
      libDepsNew[targetEntry] = valueNew;
      libDepsOld[targetEntry] = valueOld;
    }
  }

  // Generate dependency information for both old and new style CMake
  // versions.
  const char* vertest =
    "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4";
  fout << "# Generated by CMake\n\n";
  fout << "if(" << vertest << ")\n";
  fout << "  # Information for CMake 2.6 and above.\n";
  for (std::map<std::string, std::string>::const_iterator i =
         libDepsNew.begin();
       i != libDepsNew.end(); ++i) {
    if (!i->second.empty()) {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
    }
  }
  fout << "else()\n";
  fout << "  # Information for CMake 2.4 and lower.\n";
  for (std::map<std::string, std::string>::const_iterator i =
         libDepsOld.begin();
       i != libDepsOld.end(); ++i) {
    if (!i->second.empty()) {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
    }
  }
  for (std::map<std::string, std::string>::const_iterator i = libTypes.begin();
       i != libTypes.end(); ++i) {
    if (i->second != "general") {
      fout << "  set(\"" << i->first << "\" \"" << i->second << "\")\n";
    }
  }
  fout << "endif()\n";
}